

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_ghost_blow_effect1(parser *p)

{
  long *plVar1;
  void *pvVar2;
  long *plVar3;
  char *pcVar4;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 != (void *)0x0) {
    plVar1 = *(long **)((long)pvVar2 + 0x18);
    do {
      plVar3 = plVar1;
      plVar1 = (long *)*plVar3;
    } while (plVar1 != (long *)0x0);
    pcVar4 = parser_getsym(p,"effect");
    pcVar4 = string_make(pcVar4);
    plVar3[7] = (long)pcVar4;
    return PARSE_ERROR_NONE;
  }
  __assert_fail("g",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0x80e,"enum parser_error parse_ghost_blow_effect1(struct parser *)");
}

Assistant:

static enum parser_error parse_ghost_blow_effect1(struct parser *p) {
	struct ghost *g = parser_priv(p);
	struct ghost_level *l;
	assert(g);
	l = g->level;
	while (l->next) {
		l = l->next;
	}

	l->blow_effect1 = string_make(parser_getsym(p, "effect"));
	return PARSE_ERROR_NONE;
}